

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O2

bool __thiscall STrdHead::writeToFile(STrdHead *this,FILE *ftrd)

{
  size_t sVar1;
  
  if (Options::IsBigEndian == '\x01') {
    swapEndianness(this);
  }
  sVar1 = fwrite(this,0x900,1,(FILE *)ftrd);
  if ((sVar1 == 1) && (Options::IsBigEndian == '\x01')) {
    swapEndianness(this);
  }
  return sVar1 == 1;
}

Assistant:

bool STrdHead::writeToFile(FILE *ftrd) {
	if (Options::IsBigEndian) swapEndianness();		// fix endianness in binary form before write
	if (1 != fwrite(this, sizeof(STrdHead), 1, ftrd)) return false;
	if (Options::IsBigEndian) swapEndianness();		// revert endianness back to native host form
	return true;
}